

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror_test.cpp
# Opt level: O2

pint p_test_case_perror_invalid_test(void)

{
  int iVar1;
  long lVar2;
  PError *error;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar2 = p_error_get_message(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/perror_test.cpp"
           ,0x55);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_error_get_code(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/perror_test.cpp"
           ,0x56);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_error_get_native_code(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/perror_test.cpp"
           ,0x57);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_error_get_domain(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/perror_test.cpp"
           ,0x58);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_error_copy(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/perror_test.cpp"
           ,0x59);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  error = (PError *)0x1;
  p_error_set_code(0,0);
  p_error_set_native_code(0,0);
  p_error_set_message(0,0);
  p_error_set_error(0,0,0,0);
  p_error_set_error_p(0,0,0,0);
  p_error_set_error_p(&error,0,0,0);
  if (error != (PError *)0x1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/perror_test.cpp"
           ,0x65);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_error_clear(0);
  p_error_free(0);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (perror_invalid_test)
{
	p_libsys_init ();

	P_TEST_CHECK (p_error_get_message (NULL) == NULL);
	P_TEST_CHECK (p_error_get_code (NULL) == 0);
	P_TEST_CHECK (p_error_get_native_code (NULL) == 0);
	P_TEST_CHECK (p_error_get_domain (NULL) == P_ERROR_DOMAIN_NONE);
	P_TEST_CHECK (p_error_copy (NULL) == NULL);

	PError *error = (PError *) 0x1;

	p_error_set_code (NULL, 0);
	p_error_set_native_code (NULL, 0);
	p_error_set_message (NULL, NULL);

	p_error_set_error (NULL, 0, 0, NULL);
	p_error_set_error_p (NULL, 0, 0, NULL);

	p_error_set_error_p (&error, 0, 0, NULL);
	P_TEST_CHECK (error == (PError *) 0x1);

	p_error_clear (NULL);
	p_error_free (NULL);

	p_libsys_shutdown ();
}